

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O0

void telnet_send_text(telnet_t *telnet,char *buffer,size_t size)

{
  int __flags;
  size_t in_RCX;
  int __fd;
  size_t local_30;
  size_t l;
  size_t i;
  size_t size_local;
  char *buffer_local;
  telnet_t *telnet_local;
  
  local_30 = 0;
  for (l = 0; __fd = (int)telnet, l != size; l = l + 1) {
    __flags = (int)l;
    in_RCX = l;
    if (buffer[l] == -1) {
      if (l != local_30) {
        _send(__fd,buffer + local_30,l - local_30,__flags);
      }
      local_30 = l + 1;
      telnet_iac(telnet,0xff);
    }
    else if (((telnet->flags & 0x20) == 0) && ((buffer[l] == '\r' || (buffer[l] == '\n')))) {
      if (l != local_30) {
        _send(__fd,buffer + local_30,l - local_30,__flags);
      }
      local_30 = l + 1;
      if (buffer[l] == '\r') {
        _send(__fd,"\r",2,__flags);
      }
      else {
        _send(__fd,"\r\n",2,__flags);
      }
    }
  }
  if (l != local_30) {
    _send(__fd,buffer + local_30,l - local_30,(int)in_RCX);
  }
  return;
}

Assistant:

void telnet_send_text(telnet_t *telnet, const char *buffer,
		size_t size) {
	size_t i, l;

	for (l = i = 0; i != size; ++i) {
		/* dump prior portion of text, send escaped bytes */
		if (buffer[i] == (char)TELNET_IAC) {
			/* dump prior text if any */
			if (i != l) {
				_send(telnet, buffer + l, i - l);
			}
			l = i + 1;

			/* send escape */
			telnet_iac(telnet, TELNET_IAC);
		}
		/* special characters if not in BINARY mode */
		else if (!(telnet->flags & TELNET_FLAG_TRANSMIT_BINARY) &&
				 (buffer[i] == '\r' || buffer[i] == '\n')) {
			/* dump prior portion of text */
			if (i != l) {
				_send(telnet, buffer + l, i - l);
			}
			l = i + 1;

			/* automatic translation of \r -> CRNUL */
			if (buffer[i] == '\r') {
				_send(telnet, CRNUL, 2);
			}
			/* automatic translation of \n -> CRLF */
			else {
				_send(telnet, CRLF, 2);
			}
		}
	}

	/* send whatever portion of buffer is left */
	if (i != l) {
		_send(telnet, buffer + l, i - l);
	}
}